

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsystemtraytracker.cpp
# Opt level: O0

xcb_visualid_t __thiscall QXcbSystemTrayTracker::visualId(QXcbSystemTrayTracker *this)

{
  xcb_screen_t *pxVar1;
  QXcbConnection *in_RDI;
  xcb_visualid_t visual;
  QXcbSystemTrayTracker *in_stack_00000018;
  xcb_visualid_t local_c;
  
  local_c = netSystemTrayVisual(in_stack_00000018);
  if (local_c == 0) {
    QXcbConnection::primaryScreen(in_RDI);
    pxVar1 = QXcbScreen::screen((QXcbScreen *)0x1df5ae);
    local_c = pxVar1->root_visual;
  }
  return local_c;
}

Assistant:

xcb_visualid_t QXcbSystemTrayTracker::visualId()
{
    xcb_visualid_t visual = netSystemTrayVisual();
    if (visual == XCB_NONE)
        visual = m_connection->primaryScreen()->screen()->root_visual;
    return visual;
}